

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

Bond_p __thiscall indigox::Molecule::NewBond(Molecule *this,Atom_p *a,Atom_p *b)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  MolecularGraph *this_00;
  MolVertex u;
  MolVertex v;
  Atom *pAVar1;
  void *pvVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Bond *this_01;
  mapped_type *ppvVar4;
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  Bond_p BVar6;
  MolEdgeBool eb;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> local_70;
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> local_60;
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  (this->super_CountableObject<indigox::Molecule>).id_ = 0;
  (this->super_enable_shared_from_this<indigox::Molecule>)._M_weak_this.
  super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  Atom::GetMolecule((Atom *)&eb);
  __r = &(a->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
  std::__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<indigox::Molecule,void>
            ((__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2> *)&local_b0,
             (__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)__r);
  _Var3._M_pi = local_b0._M_pi;
  pvVar2 = eb.first.super_edge_base<boost::undirected_tag,_void_*>.m_source;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &eb.first.super_edge_base<boost::undirected_tag,_void_*>.m_target);
  _Var5._M_pi = extraout_RDX;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pvVar2 == _Var3._M_pi) {
    Atom::GetMolecule((Atom *)&eb);
    std::__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<indigox::Molecule,void>
              ((__shared_ptr<indigox::Molecule,(__gnu_cxx::_Lock_policy)2> *)&local_b0,
               (__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2> *)__r);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &eb.first.super_edge_base<boost::undirected_tag,_void_*>.m_target);
    _Var5._M_pi = extraout_RDX_00;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        eb.first.super_edge_base<boost::undirected_tag,_void_*>.m_source == local_b0._M_pi) {
      std::__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,&b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_50,in_RCX);
      GetBond((Molecule *)&eb,a,(Atom_p *)&local_40);
      std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)&eb);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &eb.first.super_edge_base<boost::undirected_tag,_void_*>.m_target);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      _Var5._M_pi = extraout_RDX_01;
      if ((this->super_CountableObject<indigox::Molecule>).id_ == 0) {
        this_01 = (Bond *)operator_new(0x58);
        std::__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_60,&b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>);
        std::__shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_70,in_RCX)
        ;
        Bond::Bond(this_01,(Atom_p *)&local_60,(Atom_p *)&local_70);
        std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::reset<indigox::Bond>
                  ((__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this,this_01);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
        std::vector<std::shared_ptr<indigox::Bond>,std::allocator<std::shared_ptr<indigox::Bond>>>::
        emplace_back<std::shared_ptr<indigox::Bond>&>
                  ((vector<std::shared_ptr<indigox::Bond>,std::allocator<std::shared_ptr<indigox::Bond>>>
                    *)&a[5].super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(shared_ptr<indigox::Bond> *)this);
        eb.first.super_edge_base<boost::undirected_tag,_void_*>.m_source =
             (void *)Bond::GetIndex((Bond *)(this->super_CountableObject<indigox::Molecule>).id_);
        std::
        _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_long,std::shared_ptr<indigox::Bond>&>
                  ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>,std::allocator<std::pair<unsigned_long_const,std::weak_ptr<indigox::Bond>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&a[10].super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,&eb,this);
        this_00 = (MolecularGraph *)
                  a[0x14].super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ppvVar4 = std::
                  map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                  ::at((map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                        *)(a + 0xe),b);
        u = *ppvVar4;
        ppvVar4 = std::
                  map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                  ::at((map<std::shared_ptr<indigox::Atom>,_void_*,_std::less<std::shared_ptr<indigox::Atom>_>,_std::allocator<std::pair<const_std::shared_ptr<indigox::Atom>,_void_*>_>_>
                        *)(a + 0xe),(key_type *)in_RCX);
        v = *ppvVar4;
        std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,(__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this);
        MolecularGraph::AddEdge(&eb,this_00,u,v,(Bond_p *)&local_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
        std::
        _Rb_tree<std::shared_ptr<indigox::Bond>,std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>,std::_Select1st<std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>>,std::less<std::shared_ptr<indigox::Bond>>,std::allocator<std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>>>
        ::
        _M_emplace_unique<std::shared_ptr<indigox::Bond>&,boost::detail::edge_desc_impl<boost::undirected_tag,void*>&>
                  ((_Rb_tree<std::shared_ptr<indigox::Bond>,std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>,std::_Select1st<std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>>,std::less<std::shared_ptr<indigox::Bond>>,std::allocator<std::pair<std::shared_ptr<indigox::Bond>const,boost::detail::edge_desc_impl<boost::undirected_tag,void*>>>>
                    *)(a + 0x11),(shared_ptr<indigox::Bond> *)this,&eb.first);
        pAVar1 = (b->super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_90,(__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this);
        Atom::AddBond(pAVar1,(Bond_p *)&local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
        pAVar1 = in_RCX->_M_ptr;
        std::__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_a0,(__shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2> *)this);
        Atom::AddBond(pAVar1,(Bond_p *)&local_a0);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
        *(undefined1 *)
         &a[0x15].super___shared_ptr<indigox::Atom,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             1;
        _Var5._M_pi = extraout_RDX_02;
      }
    }
  }
  BVar6.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  BVar6.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Bond_p)BVar6.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p Molecule::NewBond(Atom_p a, Atom_p b) {
  /// @todo Logging for fail reasons.
  Bond_p bnd = Bond_p();
  if (a->GetMolecule() != shared_from_this()) return bnd;
  if (b->GetMolecule() != shared_from_this()) return bnd;
  bnd = GetBond(a, b);
  if (!bnd) {
    bnd.reset(new Bond(a, b));
    bonds_.emplace_back(bnd);
    idx_to_bond_.emplace(bnd->GetIndex(), bnd);
    MolEdgeBool eb = graph_->AddEdge(atom_to_vertex_.at(a),
                                     atom_to_vertex_.at(b), bnd);
    bond_to_edge_.emplace(bnd, eb.first);
    a->AddBond(bnd);
    b->AddBond(bnd);
    modified_ = true;
  } // else Log that bond already exists.
  return bnd;
}